

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

TidyParserMemory * prvTidypopMemory(TidyDocImpl *doc)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Parser *pPVar3;
  Node *pNVar4;
  Node *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  TidyParserMemory *in_RDI;
  
  iVar1 = (doc->stack).top;
  lVar9 = (long)iVar1;
  if (-1 < lVar9) {
    pTVar2 = (doc->stack).content;
    pPVar3 = pTVar2[lVar9].identity;
    pNVar4 = pTVar2[lVar9].original_node;
    pNVar5 = pTVar2[lVar9].reentry_node;
    uVar6 = (&pTVar2[lVar9].reentry_node)[1];
    pTVar2 = pTVar2 + lVar9;
    iVar8 = pTVar2->register_1;
    uVar7 = *(undefined8 *)(&pTVar2->mode + 2);
    in_RDI->mode = pTVar2->mode;
    in_RDI->register_1 = iVar8;
    *(undefined8 *)&in_RDI->register_2 = uVar7;
    in_RDI->reentry_node = pNVar5;
    *(undefined8 *)&in_RDI->reentry_mode = uVar6;
    in_RDI->identity = pPVar3;
    in_RDI->original_node = pNVar4;
    (doc->stack).top = iVar1 + -1;
    return in_RDI;
  }
  in_RDI->mode = IgnoreWhitespace;
  in_RDI->register_1 = 0;
  *(undefined8 *)&in_RDI->register_2 = 0;
  in_RDI->reentry_node = (Node *)0x0;
  in_RDI->reentry_mode = IgnoreWhitespace;
  in_RDI->reentry_state = 0;
  in_RDI->identity = (Parser *)0x0;
  in_RDI->original_node = (Node *)0x0;
  return in_RDI;
}

Assistant:

TidyParserMemory TY_(popMemory)( TidyDocImpl* doc )
{
    if ( !TY_(isEmptyParserStack)( doc ) )
    {
        TidyParserMemory data = doc->stack.content[doc->stack.top];
        DEBUG_LOG(SPRTF("\n"
                        "<--POP  original: %s @ %p\n"
                        "         reentry: %s @ %p\n"
                        "     stack depth: %lu @ %p\n"
                        "            mode: %u\n"
                        "      register 1: %i\n"
                        "      register 2: %i\n\n",
                        data.original_node ? data.original_node->element : "none", data.original_node,
                        data.reentry_node ? data.reentry_node->element : "none", data.reentry_node,
                        doc->stack.top, &doc->stack.content[doc->stack.top],
                        data.mode,
                        data.register_1,
                        data.register_2
                        ));
        doc->stack.top = doc->stack.top - 1;
        return data;
    }
    TidyParserMemory blank = { NULL };
    return blank;
}